

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall
TTD::ThreadContextTTD::ForceSetRootInfoInRestore
          (ThreadContextTTD *this,TTD_LOG_PTR_ID logid,RecyclableObject *obj,bool maybeLongLived)

{
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined7 in_register_00000009;
  TTD_LOG_PTR_ID local_30;
  TTD_LOG_PTR_ID logid_local;
  RecyclableObject *obj_local;
  bool maybeLongLived_local;
  
  local_30 = logid;
  logid_local = (TTD_LOG_PTR_ID)obj;
  obj_local._7_1_ = maybeLongLived;
  JsUtil::
  BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->m_ttdRootTagToObjectMap,&local_30,(RecyclableObject **)&logid_local);
  if ((int)CONCAT71(in_register_00000009,maybeLongLived) != 0) {
    JsUtil::
    BaseDictionary<unsigned_long,bool,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_long,bool,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<unsigned_long,bool,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&this->m_ttdMayBeLongLivedRoot,&local_30,(bool *)((long)&obj_local + 7));
  }
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->m_ttdReplayRootPinSet);
  JsUtil::
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::AddNew(this_00,(RecyclableObject **)&logid_local);
  return;
}

Assistant:

void ThreadContextTTD::ForceSetRootInfoInRestore(TTD_LOG_PTR_ID logid, Js::RecyclableObject* obj, bool maybeLongLived)
    {
        this->m_ttdRootTagToObjectMap.Item(logid, obj);
        if(maybeLongLived)
        {
            this->m_ttdMayBeLongLivedRoot.Item(logid, maybeLongLived);
        }

        this->m_ttdReplayRootPinSet->AddNew(obj);
    }